

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

VCameraInfo * __thiscall
ViconDataStreamSDK::Core::VClient::GetCamera(VClient *this,string *i_rCameraName,Enum *o_rResult)

{
  bool bVar1;
  vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_> *this_00;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  local_70 [3];
  string *local_58;
  VCameraInfo *local_50;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  local_48;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  local_40;
  __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
  rCameraIt;
  scoped_lock Lock;
  Enum *o_rResult_local;
  string *i_rCameraName_local;
  VClient *this_local;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)&rCameraIt,&this->m_FrameMutex);
  this_00 = &(this->m_LatestFrame).m_Cameras;
  local_48._M_current =
       (VCameraInfo *)
       std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>::begin
                 (this_00);
  local_50 = (VCameraInfo *)
             std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>::
             end(this_00);
  local_58 = i_rCameraName;
  local_40 = std::
             find_if<__gnu_cxx::__normal_iterator<ViconCGStream::VCameraInfo_const*,std::vector<ViconCGStream::VCameraInfo,std::allocator<ViconCGStream::VCameraInfo>>>,ViconDataStreamSDK::Core::VClient::GetCamera(std::__cxx11::string_const&,ViconDataStreamSDK::Core::Result::Enum&)const::__0>
                       (local_48,(__normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
                                  )local_50,(anon_class_8_1_ec6174ac_for__M_pred)i_rCameraName);
  local_70[0]._M_current =
       (VCameraInfo *)
       std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>::end
                 (&(this->m_LatestFrame).m_Cameras);
  bVar1 = __gnu_cxx::operator!=(&local_40,local_70);
  if (bVar1) {
    *o_rResult = Success;
    this_local = (VClient *)
                 __gnu_cxx::
                 __normal_iterator<const_ViconCGStream::VCameraInfo_*,_std::vector<ViconCGStream::VCameraInfo,_std::allocator<ViconCGStream::VCameraInfo>_>_>
                 ::operator*(&local_40);
  }
  else {
    *o_rResult = InvalidCameraName;
    this_local = (VClient *)0x0;
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)&rCameraIt);
  return (VCameraInfo *)this_local;
}

Assistant:

const ViconCGStream::VCameraInfo * VClient::GetCamera( const std::string & i_rCameraName, Result::Enum & o_rResult ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  const auto rCameraIt = 
    std::find_if( m_LatestFrame.m_Cameras.begin(), m_LatestFrame.m_Cameras.end(),
      [&i_rCameraName]( const ViconCGStream::VCameraInfo & rCamera )
        { return AdaptCameraName( rCamera.m_Name, rCamera.m_DisplayType, rCamera.m_CameraID ) == i_rCameraName; }
    );

  if( rCameraIt != m_LatestFrame.m_Cameras.end() )
  {
    o_rResult = Result::Success;
    return &(*rCameraIt);
  }

  o_rResult = Result::InvalidCameraName;
  return nullptr;
}